

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlineCall(Inline *this,Instr *callInstr,FunctionJITTimeInfo *funcInfo,
                  FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,bool *pIsInlined,
                  uint callSiteId,uint recursiveInlineDepth,bool isCallInstanceFunction)

{
  code *pcVar1;
  bool bVar2;
  _E _Var3;
  IRType IVar4;
  ArgSlot AVar5;
  OpCode opcode;
  uint uVar6;
  uint uVar7;
  JITTimeFunctionBody *this_00;
  Instr *pIVar8;
  Opnd *pOVar9;
  char16 *inlineeName;
  JITTimeWorkItem *this_01;
  FunctionJITTimeInfo *topFunc;
  Func *this_02;
  undefined4 *puVar10;
  RegOpnd *pRVar11;
  IntConstOpnd *newSrc;
  Instr *this_03;
  StackSym *pSVar12;
  Instr *this_04;
  SymOpnd *dstOpnd;
  int iVar13;
  Instr *local_150;
  SymOpnd *newLinkOpnd;
  StackSym *symDst;
  Instr *assignInstr;
  Opnd *tempDst;
  StackSym *stackSym;
  Opnd *orgSrc1;
  uint i;
  Instr *orgArgout;
  Instr *clonedArgout;
  Instr *insertBeforeInstr;
  Instr *startCall;
  uint actualCountToInlinedCall;
  Instr *instr;
  SymOpnd *orgLinkOpnd;
  Instr *functionInstr;
  Instr *dummyInstr;
  Instr *argSecond;
  Instr *argImplicitThisInstr;
  uint actualCount;
  Instr *returnInstr;
  FunctionJITTimeInfo *inlineeData;
  Opnd *linkOpnd;
  Func *pFStack_58;
  BuiltinFunction builtInId;
  Func *func;
  Instr *instrNext;
  bool isCallInstanceFunction_local;
  bool *pIsInlined_local;
  StackSym *symCallerThis_local;
  FunctionJITTimeInfo *inlinerData_local;
  FunctionJITTimeInfo *funcInfo_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  this_local = (Inline *)callInstr->m_next;
  pFStack_58 = callInstr->m_func;
  uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(funcInfo);
  linkOpnd._7_1_ = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar6);
  *pIsInlined = false;
  uVar6 = Func::GetSourceContextId(this->topFunc);
  uVar7 = Func::GetLocalFunctionId(this->topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineCallPhase,uVar6,uVar7);
  if (!bVar2) {
    uVar6 = Func::GetSourceContextId(pFStack_58);
    uVar7 = Func::GetLocalFunctionId(pFStack_58);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineCallPhase,uVar6,uVar7);
    if (!bVar2) {
      this_00 = Func::GetJITFunctionBody(this->topFunc);
      AVar5 = JITTimeFunctionBody::GetInParamsCount(this_00);
      if (AVar5 != 0) {
        inlineeData = (FunctionJITTimeInfo *)IR::Instr::GetSrc2(callInstr);
        pIVar8 = GetDefInstr((Opnd *)inlineeData);
        pOVar9 = IR::Instr::GetSrc2(pIVar8);
        bVar2 = IR::Opnd::IsSymOpnd(pOVar9);
        if (bVar2) {
          *pIsInlined = true;
          returnInstr = (Instr *)0x0;
          _actualCount = (Instr *)0x0;
          uVar6 = Func::GetSourceContextId(this->topFunc);
          uVar7 = Func::GetLocalFunctionId(this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineCallTargetPhase,uVar6,uVar7);
          if ((bVar2) ||
             (bVar2 = InlineCallTarget(this,callInstr,inlinerData,
                                       (FunctionJITTimeInfo **)&returnInstr,funcInfo,symCallerThis,
                                       (Instr **)&actualCount,recursiveInlineDepth,
                                       isCallInstanceFunction), !bVar2)) {
            argImplicitThisInstr._7_1_ = linkOpnd._7_1_;
            inlineeName = Js::JavascriptLibrary::GetNameForBuiltIn(linkOpnd._7_1_);
            this_01 = Func::GetWorkItem(this->topFunc);
            topFunc = JITTimeWorkItem::GetJITTimeInfo(this_01);
            this_02 = Func::GetTopFunc(callInstr->m_func);
            bVar2 = Func::IsLoopBody(this_02);
            _Var3 = Js::BuiltinFunction::operator_cast_to__E
                              ((BuiltinFunction *)((long)&linkOpnd + 7));
            TraceInlining(inlinerData,inlineeName,(char16 *)0x0,0,topFunc,0,
                          (FunctionJITTimeInfo *)0x0,callSiteId,bVar2,(uint)_Var3);
            argImplicitThisInstr._0_4_ = 0;
            bVar2 = IR::Opnd::IsSymOpnd((Opnd *)inlineeData);
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0xcdb,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            argSecond = (Instr *)0x0;
            dummyInstr = (Instr *)0x0;
            functionInstr = (Instr *)0x0;
            GetArgInstrsForCallAndApply
                      (this,callInstr,&argSecond,&dummyInstr,&functionInstr,
                       (uint *)&argImplicitThisInstr);
            if (isCallInstanceFunction) {
              local_150 = dummyInstr;
            }
            else {
              local_150 = argSecond;
            }
            if (local_150 == (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0xce5,"(functionInstr)","functionInstr");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            pOVar9 = IR::Instr::GetSrc2(callInstr);
            instr = (Instr *)IR::Opnd::AsSymOpnd(pOVar9);
            EmitFixedMethodOrFunctionObjectChecksForBuiltIns
                      (this,callInstr,callInstr,funcInfo,false,true,false,true);
            pIVar8 = InsertInlineeBuiltInStartEndTags
                               (this,callInstr,(uint)argImplicitThisInstr,(Instr **)0x0);
            pIVar8->m_opcode = InlineNonTrackingBuiltInEnd;
            iVar13 = 1;
            if (isCallInstanceFunction) {
              iVar13 = 2;
            }
            orgSrc1._4_4_ = (uint)argImplicitThisInstr - iVar13;
            pIVar8 = IR::Instr::New(StartCall,pFStack_58);
            pRVar11 = IR::RegOpnd::New(TyVar,pFStack_58);
            IR::Instr::SetDst(pIVar8,&pRVar11->super_Opnd);
            newSrc = IR::IntConstOpnd::New((ulong)orgSrc1._4_4_,TyInt32,pFStack_58,false);
            IR::Instr::SetSrc1(pIVar8,&newSrc->super_Opnd);
            IR::Instr::InsertBefore(callInstr,pIVar8);
            pOVar9 = IR::Instr::GetSrc1(local_150);
            IR::Instr::ReplaceSrc1(callInstr,pOVar9);
            IR::Instr::UnlinkSrc2(callInstr);
            callInstr->m_opcode = CallI;
            orgArgout = (Instr *)0x0;
            clonedArgout = callInstr;
            for (; orgSrc1._4_4_ != 0; orgSrc1._4_4_ = orgSrc1._4_4_ - 1) {
              this_03 = GetDefInstr((Opnd *)instr);
              pOVar9 = IR::Instr::GetSrc2(this_03);
              instr = (Instr *)IR::Opnd::AsSymOpnd(pOVar9);
              pOVar9 = IR::Instr::GetSrc1(this_03);
              pSVar12 = IR::Opnd::GetStackSym(pOVar9);
              IVar4 = StackSym::GetType(pSVar12);
              pSVar12 = StackSym::New(IVar4,local_150->m_func);
              IVar4 = IR::Opnd::GetType(pOVar9);
              pRVar11 = IR::RegOpnd::New(pSVar12,IVar4,local_150->m_func);
              IVar4 = IR::Opnd::GetType(pOVar9);
              opcode = Func::GetLoadOpForType(IVar4);
              this_04 = IR::Instr::New(opcode,&pRVar11->super_Opnd,pOVar9,local_150->m_func);
              IR::Instr::SetByteCodeOffset(this_04,this_03);
              IR::Opnd::SetIsJITOptimizedReg(&pRVar11->super_Opnd,true);
              IR::Instr::InsertBefore(this_03,this_04);
              pSVar12 = SymTable::GetArgSlotSym
                                  (callInstr->m_func->m_symTable,(ArgSlot)orgSrc1._4_4_);
              dstOpnd = IR::SymOpnd::New(&pSVar12->super_Sym,0,TyVar,pFStack_58);
              orgArgout = IR::Instr::New(ArgOut_A,&dstOpnd->super_Opnd,&pRVar11->super_Opnd,
                                         pFStack_58);
              IR::Instr::SetSrc2(clonedArgout,&dstOpnd->super_Opnd);
              IR::Instr::InsertBefore(clonedArgout,orgArgout);
              clonedArgout = orgArgout;
            }
            pOVar9 = IR::Instr::GetDst(pIVar8);
            IR::Instr::SetSrc2(orgArgout,pOVar9);
            pIVar8 = GetDefInstr((Opnd *)instr);
            if (pIVar8 != local_150) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0xd16,"(GetDefInstr(orgLinkOpnd) == functionInstr)",
                                 "GetDefInstr(orgLinkOpnd) == functionInstr");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
          }
          else {
            if (_actualCount == (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0xcd0,"(returnInstr)","returnInstr");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            this_local = (Inline *)_actualCount;
          }
        }
      }
    }
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr*
Inline::InlineCall(IR::Instr *callInstr, const FunctionJITTimeInfo *funcInfo, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, bool* pIsInlined, uint callSiteId, uint recursiveInlineDepth, bool isCallInstanceFunction)
{
    IR::Instr* instrNext = callInstr->m_next;
    Func *func = callInstr->m_func;
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(funcInfo->GetLocalFunctionId());

    *pIsInlined = false;
    if (PHASE_OFF(Js::InlineCallPhase, this->topFunc) || PHASE_OFF(Js::InlineCallPhase, func)
        || !this->topFunc->GetJITFunctionBody()->GetInParamsCount())
    {
        return instrNext;
    }

    // Convert all the current ARG_OUT to  ArgOut_A_InlineBuiltIn
    IR::Opnd *linkOpnd = callInstr->GetSrc2();

    if (!GetDefInstr(linkOpnd)->GetSrc2()->IsSymOpnd())
    {
        // There is no benefit of inlining.call() with no arguments.
        return instrNext;
    }

    *pIsInlined = true;
    const FunctionJITTimeInfo * inlineeData = nullptr;

    IR::Instr * returnInstr = nullptr;
    if (!PHASE_OFF(Js::InlineCallTargetPhase, this->topFunc))
    {
        if (InlineCallTarget(callInstr, inlinerData, &inlineeData, funcInfo, symCallerThis, &returnInstr, recursiveInlineDepth, isCallInstanceFunction))
        {
            Assert(returnInstr);
            return returnInstr;
        }
    }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    TraceInlining(inlinerData, Js::JavascriptLibrary::GetNameForBuiltIn(builtInId),
        nullptr, 0, this->topFunc->GetWorkItem()->GetJITTimeInfo(), 0, nullptr, callSiteId, callInstr->m_func->GetTopFunc()->IsLoopBody(), builtInId);
#endif

    uint actualCount = 0;
    Assert(linkOpnd->IsSymOpnd());

    // We are trying to optimize this.superConstructor.call(this, a, b,c);
    // argImplicitInstr represents this.superConstructor which we need to call directly.
    IR::Instr * argImplicitThisInstr = nullptr;
    IR::Instr * argSecond = nullptr;
    IR::Instr * dummyInstr = nullptr;
    this->GetArgInstrsForCallAndApply(callInstr, &argImplicitThisInstr, &argSecond, &dummyInstr, actualCount);

    IR::Instr * functionInstr = isCallInstanceFunction ? argSecond : argImplicitThisInstr;
    Assert(functionInstr);

    IR::SymOpnd* orgLinkOpnd = callInstr->GetSrc2()->AsSymOpnd();

    EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, funcInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);

    IR::Instr *instr = InsertInlineeBuiltInStartEndTags(callInstr, actualCount);
    instr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;

    uint actualCountToInlinedCall = actualCount - (isCallInstanceFunction ? 2 : 1);

    IR::Instr *startCall = IR::Instr::New(Js::OpCode::StartCall, func);
    startCall->SetDst(IR::RegOpnd::New(TyVar, func));
    startCall->SetSrc1(IR::IntConstOpnd::New(actualCountToInlinedCall, TyInt32, func)); // New call will have one less parameter.

    callInstr->InsertBefore(startCall);

    callInstr->ReplaceSrc1(functionInstr->GetSrc1());
    callInstr->UnlinkSrc2();
    callInstr->m_opcode = Js::OpCode::CallI;

    IR::Instr* insertBeforeInstr = callInstr;
    IR::Instr* clonedArgout = nullptr;
    IR::Instr* orgArgout = nullptr;

    for (uint i = actualCountToInlinedCall ; i > 0; i--)
    {
        orgArgout = GetDefInstr(orgLinkOpnd);
        orgLinkOpnd = orgArgout->GetSrc2()->AsSymOpnd();
        IR::Opnd *orgSrc1 = orgArgout->GetSrc1();

        // Change ArgOut to use temp as src1.
        StackSym * stackSym = StackSym::New(orgSrc1->GetStackSym()->GetType(), functionInstr->m_func);
        IR::Opnd* tempDst = IR::RegOpnd::New(stackSym, orgSrc1->GetType(), functionInstr->m_func);
        IR::Instr *assignInstr = IR::Instr::New(Func::GetLoadOpForType(orgSrc1->GetType()), tempDst, orgSrc1, functionInstr->m_func);
        assignInstr->SetByteCodeOffset(orgArgout);
        tempDst->SetIsJITOptimizedReg(true);
        orgArgout->InsertBefore(assignInstr);

        StackSym *symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(i));
        IR::SymOpnd* newLinkOpnd = IR::SymOpnd::New(symDst, 0, TyVar, func);

        clonedArgout = IR::Instr::New(Js::OpCode::ArgOut_A, newLinkOpnd, tempDst, func);
        insertBeforeInstr->SetSrc2(newLinkOpnd);

        insertBeforeInstr->InsertBefore(clonedArgout);
        insertBeforeInstr = clonedArgout;
    }
    clonedArgout->SetSrc2(startCall->GetDst());
    Assert(GetDefInstr(orgLinkOpnd) == functionInstr);
    return instrNext;
}